

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplerate.c
# Opt level: O0

SRC_STATE * src_clone(SRC_STATE *orig,int *error)

{
  SRC_STATE *state;
  int *error_local;
  SRC_STATE *orig_local;
  
  if (orig == (SRC_STATE *)0x0) {
    if (error != (int *)0x0) {
      *error = 2;
    }
    orig_local = (SRC_STATE *)0x0;
  }
  else {
    if (error != (int *)0x0) {
      *error = 0;
    }
    orig_local = (*orig->vt->copy)(orig);
    if ((orig_local == (SRC_STATE *)0x0) && (error != (int *)0x0)) {
      *error = 1;
    }
  }
  return orig_local;
}

Assistant:

SRC_STATE*
src_clone (SRC_STATE* orig, int *error)
{
	if (!orig)
	{
		if (error)
			*error = SRC_ERR_BAD_STATE ;
		return NULL ;
	}
	if (error)
		*error = SRC_ERR_NO_ERROR ;

	SRC_STATE *state = orig->vt->copy (orig) ;
	if (!state)
		if (error)
			*error = SRC_ERR_MALLOC_FAILED ;

	return state ;
}